

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O3

CTypeID lj_ctype_intern(CTState *cts,CTInfo info,CTSize size)

{
  uint uVar1;
  uint uVar2;
  CType *pCVar3;
  ushort uVar4;
  
  uVar2 = (size ^ info) - (size << 0xe | size >> 0x12);
  uVar2 = (size >> 0xd ^ uVar2) - (uVar2 >> 0x13) & 0x7f;
  uVar4 = cts->hash[uVar2];
  if (uVar4 != 0) {
    pCVar3 = cts->tab;
    do {
      if ((pCVar3[uVar4].info == info) && (pCVar3[uVar4].size == size)) {
        return (uint)uVar4;
      }
      uVar4 = pCVar3[uVar4].next;
    } while (uVar4 != 0);
  }
  uVar1 = cts->top;
  if (uVar1 < cts->sizetab) {
    pCVar3 = cts->tab;
  }
  else {
    if (0xffff < uVar1) {
      lj_err_msg(cts->L,LJ_ERR_TABOV);
    }
    pCVar3 = (CType *)lj_mem_grow(cts->L,cts->tab,&cts->sizetab,0x10000,0x10);
    cts->tab = pCVar3;
  }
  cts->top = uVar1 + 1;
  pCVar3[uVar1].info = info;
  pCVar3[uVar1].size = size;
  pCVar3[uVar1].sib = 0;
  pCVar3[uVar1].next = cts->hash[uVar2];
  pCVar3[uVar1].name.gcptr32 = 0;
  cts->hash[uVar2] = (CTypeID1)uVar1;
  return uVar1;
}

Assistant:

CTypeID lj_ctype_intern(CTState *cts, CTInfo info, CTSize size)
{
  uint32_t h = ct_hashtype(info, size);
  CTypeID id = cts->hash[h];
  lj_assertCTS(cts->L, "uninitialized cts->L");
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (ct->info == info && ct->size == size)
      return id;
    id = ct->next;
  }
  id = cts->top;
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    CType *ct;
#endif
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    ct = lj_mem_newvec(cts->L, id+1, CType);
    memcpy(ct, cts->tab, id*sizeof(CType));
    memset(cts->tab, 0, id*sizeof(CType));
    lj_mem_freevec(cts->g, cts->tab, cts->sizetab, CType);
    cts->tab = ct;
    cts->sizetab = id+1;
#else
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
#endif
  }
  cts->top = id+1;
  cts->tab[id].info = info;
  cts->tab[id].size = size;
  cts->tab[id].sib = 0;
  cts->tab[id].next = cts->hash[h];
  setgcrefnull(cts->tab[id].name);
  cts->hash[h] = (CTypeID1)id;
  return id;
}